

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmConsoleMain::set_statusline_mode(CVmConsoleMain *this,int mode)

{
  CVmConsole *console;
  int in_ESI;
  CVmFormatterStatline *in_RDI;
  CVmFormatter *unaff_retaddr;
  CVmFormatterDisp *str;
  CVmConsole *local_18;
  uint in_stack_fffffffffffffff0;
  CVmFormatterStatline *s;
  
  s = in_RDI;
  if ((in_ESI != 0) &&
     (*(long *)((in_RDI->super_CVmFormatterDisp).super_CVmFormatter.linebuf_ + 8) == 0)) {
    console = (CVmConsole *)operator_new(0xf040);
    CVmFormatterStatline::CVmFormatterStatline(in_RDI,console);
    *(CVmConsole **)((in_RDI->super_CVmFormatterDisp).super_CVmFormatter.linebuf_ + 8) = console;
    (**(code **)(**(long **)((in_RDI->super_CVmFormatterDisp).super_CVmFormatter.linebuf_ + 8) + 8))
              ();
  }
  if (in_ESI == 0) {
    local_18 = *(CVmConsole **)((in_RDI->super_CVmFormatterDisp).super_CVmFormatter.linebuf_ + 6);
  }
  else {
    local_18 = *(CVmConsole **)((in_RDI->super_CVmFormatterDisp).super_CVmFormatter.linebuf_ + 8);
  }
  if (local_18 != (in_RDI->super_CVmFormatterDisp).super_CVmFormatter.console_) {
    (in_RDI->super_CVmFormatterDisp).super_CVmFormatter.console_ = local_18;
    if (in_ESI == 0) {
      CVmFormatter::format_text(unaff_retaddr,(char *)s,(ulong)in_stack_fffffffffffffff0);
      CVmFormatter::flush(unaff_retaddr,(vm_nl_type)((ulong)s >> 0x20));
      if ((in_RDI->super_CVmFormatterDisp).super_CVmFormatter.cmap_ != (CCharmapToLocal *)0x0) {
        *(byte *)&(in_RDI->super_CVmFormatterDisp).super_CVmFormatter.linepos_ =
             (byte)(in_RDI->super_CVmFormatterDisp).super_CVmFormatter.linepos_ & 0xfe | 1;
      }
    }
    else {
      *(byte *)&(in_RDI->super_CVmFormatterDisp).super_CVmFormatter.linepos_ =
           (byte)(in_RDI->super_CVmFormatterDisp).super_CVmFormatter.linepos_ & 0xfe;
    }
    os_status(0);
  }
  return;
}

Assistant:

void CVmConsoleMain::set_statusline_mode(VMG_ int mode)
{
    CVmFormatterDisp *str;

    /* 
     *   if we're switching into statusline mode, and we don't have a
     *   statusline stream yet, create one 
     */
    if (mode && statline_str_ == 0)
    {
        /* create and initialize the statusline stream */
        statline_str_ = new CVmFormatterStatline(this);
        statline_str_->init();
    }

    /* get the stream selected by the new mode */
    if (mode)
        str = statline_str_;
    else
        str = main_disp_str_;

    /* if this is already the active stream, we have nothing more to do */
    if (str == disp_str_)
        return;

    /* make the new stream current */
    disp_str_ = str;

    /* 
     *   check which mode we're switching to, so we can do some extra work
     *   specific to each mode 
     */
    if (mode)
    {
        /* 
         *   we're switching to the status line, so disable the log stream -
         *   statusline text is never sent to the log, since the log reflects
         *   only what was displayed in the main text area 
         */
        log_enabled_ = FALSE;
    }
    else
    {
        /*
         *   we're switching back to the main stream, so flush the statusline
         *   so we're sure the statusline text is displayed 
         */

        /* end the line */
        statline_str_->format_text(vmg_ "\n", 1);

        /* flush output */
        statline_str_->flush(vmg_ VM_NL_NONE);

        /* re-enable the log stream, if we have one */
        if (log_str_ != 0)
            log_enabled_ = TRUE;
    }

    /* switch at the OS layer */
    os_status(mode);
}